

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  printOpenHeader(this,_name);
  poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000001d7e80 = 0x2e2e2e2e2e2e2e;
    uRam00000000001d7e87._0_1_ = '.';
    uRam00000000001d7e87._1_1_ = '.';
    uRam00000000001d7e87._2_1_ = '.';
    uRam00000000001d7e87._3_1_ = '.';
    uRam00000000001d7e87._4_1_ = '.';
    uRam00000000001d7e87._5_1_ = '.';
    uRam00000000001d7e87._6_1_ = '.';
    uRam00000000001d7e87._7_1_ = '.';
    DAT_001d7e70 = '.';
    DAT_001d7e70_1._0_1_ = '.';
    DAT_001d7e70_1._1_1_ = '.';
    DAT_001d7e70_1._2_1_ = '.';
    DAT_001d7e70_1._3_1_ = '.';
    DAT_001d7e70_1._4_1_ = '.';
    DAT_001d7e70_1._5_1_ = '.';
    DAT_001d7e70_1._6_1_ = '.';
    uRam00000000001d7e78 = 0x2e2e2e2e2e2e2e;
    DAT_001d7e7f = 0x2e;
    DAT_001d7e60 = '.';
    DAT_001d7e60_1._0_1_ = '.';
    DAT_001d7e60_1._1_1_ = '.';
    DAT_001d7e60_1._2_1_ = '.';
    DAT_001d7e60_1._3_1_ = '.';
    DAT_001d7e60_1._4_1_ = '.';
    DAT_001d7e60_1._5_1_ = '.';
    DAT_001d7e60_1._6_1_ = '.';
    uRam00000000001d7e68._0_1_ = '.';
    uRam00000000001d7e68._1_1_ = '.';
    uRam00000000001d7e68._2_1_ = '.';
    uRam00000000001d7e68._3_1_ = '.';
    uRam00000000001d7e68._4_1_ = '.';
    uRam00000000001d7e68._5_1_ = '.';
    uRam00000000001d7e68._6_1_ = '.';
    uRam00000000001d7e68._7_1_ = '.';
    DAT_001d7e50 = '.';
    DAT_001d7e50_1._0_1_ = '.';
    DAT_001d7e50_1._1_1_ = '.';
    DAT_001d7e50_1._2_1_ = '.';
    DAT_001d7e50_1._3_1_ = '.';
    DAT_001d7e50_1._4_1_ = '.';
    DAT_001d7e50_1._5_1_ = '.';
    DAT_001d7e50_1._6_1_ = '.';
    uRam00000000001d7e58._0_1_ = '.';
    uRam00000000001d7e58._1_1_ = '.';
    uRam00000000001d7e58._2_1_ = '.';
    uRam00000000001d7e58._3_1_ = '.';
    uRam00000000001d7e58._4_1_ = '.';
    uRam00000000001d7e58._5_1_ = '.';
    uRam00000000001d7e58._6_1_ = '.';
    uRam00000000001d7e58._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam00000000001d7e48._0_1_ = '.';
    uRam00000000001d7e48._1_1_ = '.';
    uRam00000000001d7e48._2_1_ = '.';
    uRam00000000001d7e48._3_1_ = '.';
    uRam00000000001d7e48._4_1_ = '.';
    uRam00000000001d7e48._5_1_ = '.';
    uRam00000000001d7e48._6_1_ = '.';
    uRam00000000001d7e48._7_1_ = '.';
    DAT_001d7e8f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}